

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

int __thiscall
CConsole::PossibleCommands
          (CConsole *this,char *pStr,int FlagMask,bool Temp,FPossibleCallback pfnCallback,
          void *pUser)

{
  char *pcVar1;
  undefined1 in_CL;
  uint in_EDX;
  long in_RDI;
  code *in_R8;
  undefined8 in_R9;
  CCommand *pCommand;
  int Index;
  undefined8 local_38;
  undefined4 local_2c;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar2;
  
  uVar2 = CONCAT13(in_CL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  local_2c = 0;
  for (local_38 = *(long *)(in_RDI + 0x28); local_38 != 0; local_38 = *(long *)(local_38 + 0x28)) {
    if (((*(uint *)(local_38 + 0x30) & in_EDX) != 0) &&
       ((*(byte *)(local_38 + 0x34) & 1) == ((byte)(uVar2 >> 0x18) & 1))) {
      pcVar1 = str_find_nocase((char *)CONCAT44(in_EDX,uVar2),(char *)in_R8);
      if (pcVar1 != (char *)0x0) {
        (*in_R8)(local_2c,*(undefined8 *)(local_38 + 0x10),in_R9);
        local_2c = local_2c + 1;
      }
    }
  }
  return local_2c;
}

Assistant:

int CConsole::PossibleCommands(const char *pStr, int FlagMask, bool Temp, FPossibleCallback pfnCallback, void *pUser)
{
	int Index = 0;
	for(CCommand *pCommand = m_pFirstCommand; pCommand; pCommand = pCommand->m_pNext)
	{
		if(pCommand->m_Flags&FlagMask && pCommand->m_Temp == Temp && str_find_nocase(pCommand->m_pName, pStr))
		{
			pfnCallback(Index, pCommand->m_pName, pUser);
			Index++;
		}
	}
	return Index;
}